

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::applyOncePragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  flat_hash_set<const_char_*> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  SourceManager *this_00;
  group_type_pointer pgVar4;
  value_type_pointer ppcVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  SourceLocation SVar8;
  ulong pos0;
  value_type *elements;
  ulong uVar9;
  ulong hash;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  undefined1 auVar17 [16];
  string_view sVar18;
  locator res;
  char *local_58;
  ulong local_50;
  locator local_48;
  
  ensurePragmaArgs(this,pragma,0);
  this_00 = this->sourceManager;
  SVar8 = Token::location(&(pragma->super_DirectiveSyntax).directive);
  sVar18 = SourceManager::getSourceText(this_00,(BufferID)(SVar8._0_4_ & 0xfffffff));
  local_58 = sVar18._M_str;
  if (sVar18._M_len != 0) {
    arrays_ = &this->includeOnceHeaders;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_58;
    hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->includeOnceHeaders).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                          .arrays.groups_size_index & 0x3f);
    pgVar4 = (this->includeOnceHeaders).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
             .arrays.groups_;
    uVar3 = *(undefined4 *)
             (boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word + (hash & 0xff) * 4);
    ppcVar5 = (this->includeOnceHeaders).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
              .arrays.elements_;
    local_50 = (this->includeOnceHeaders).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
               .arrays.groups_size_mask;
    uVar9 = 0;
    uVar12 = pos0;
    do {
      pgVar2 = pgVar4 + uVar12;
      uVar13 = (uchar)uVar3;
      auVar17[0] = -(pgVar2->m[0].n == uVar13);
      uVar14 = (uchar)((uint)uVar3 >> 8);
      auVar17[1] = -(pgVar2->m[1].n == uVar14);
      uVar15 = (uchar)((uint)uVar3 >> 0x10);
      auVar17[2] = -(pgVar2->m[2].n == uVar15);
      uVar16 = (uchar)((uint)uVar3 >> 0x18);
      auVar17[3] = -(pgVar2->m[3].n == uVar16);
      auVar17[4] = -(pgVar2->m[4].n == uVar13);
      auVar17[5] = -(pgVar2->m[5].n == uVar14);
      auVar17[6] = -(pgVar2->m[6].n == uVar15);
      auVar17[7] = -(pgVar2->m[7].n == uVar16);
      auVar17[8] = -(pgVar2->m[8].n == uVar13);
      auVar17[9] = -(pgVar2->m[9].n == uVar14);
      auVar17[10] = -(pgVar2->m[10].n == uVar15);
      auVar17[0xb] = -(pgVar2->m[0xb].n == uVar16);
      auVar17[0xc] = -(pgVar2->m[0xc].n == uVar13);
      auVar17[0xd] = -(pgVar2->m[0xd].n == uVar14);
      auVar17[0xe] = -(pgVar2->m[0xe].n == uVar15);
      auVar17[0xf] = -(pgVar2->m[0xf].n == uVar16);
      for (uVar10 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); uVar10 != 0;
          uVar10 = uVar10 - 1 & uVar10) {
        uVar6 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        if (local_58 == ppcVar5[uVar12 * 0xf + (ulong)uVar6]) {
          if (ppcVar5 + uVar12 * 0xf + (ulong)uVar6 != (value_type_pointer)0x0) {
            return;
          }
          goto LAB_00211f0a;
        }
      }
      if ((pgVar4[uVar12].m[0xf].n &
          *(byte *)((long)&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift + (ulong)((uint)hash & 7))) == 0)
      break;
      lVar11 = uVar12 + uVar9;
      uVar9 = uVar9 + 1;
      uVar12 = lVar11 + 1U & local_50;
    } while (uVar9 <= local_50);
LAB_00211f0a:
    if ((this->includeOnceHeaders).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
        .size_ctrl.size <
        (this->includeOnceHeaders).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
      ::nosize_unchecked_emplace_at<char_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
                  *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_58);
      psVar1 = &(this->includeOnceHeaders).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
      ::unchecked_emplace_with_rehash<char_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
                  *)arrays_,hash,&local_58);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyOncePragma(const PragmaDirectiveSyntax& pragma) {
    ensurePragmaArgs(pragma, 0);

    auto text = sourceManager.getSourceText(pragma.directive.location().buffer());
    if (!text.empty())
        includeOnceHeaders.emplace(text.data());
}